

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key_io_tests.cpp
# Opt level: O0

void __thiscall key_io_tests::key_io_valid_parse::test_method(key_io_valid_parse *this)

{
  Span<const_std::byte> s;
  Span<const_std::byte> s_00;
  string_view key;
  string_view key_00;
  string_view key_01;
  string_view key_02;
  string_view key_03;
  string_view jsondata;
  string_view hex_str;
  Span<const_unsigned_char> s_01;
  Span<const_unsigned_char> s_02;
  string_view chain;
  bool bVar1;
  bool bVar2;
  undefined1 uVar3;
  size_t sVar4;
  UniValue *pUVar5;
  reference pcVar6;
  long in_FS_OFFSET;
  char *c;
  string *__range3;
  bool isCompressed;
  bool try_case_flip;
  bool isPrivkey;
  UniValue *metadata;
  UniValue *test;
  uint idx;
  iterator __end3;
  iterator __begin3;
  vector<std::byte,_std::allocator<std::byte>_> exp_payload;
  CKey privkey;
  CScript script;
  string exp_base58string;
  string strTest;
  CTxDestination destination;
  UniValue tests;
  char *in_stack_fffffffffffff4d8;
  UniValue *in_stack_fffffffffffff4e0;
  char *in_stack_fffffffffffff4e8;
  UniValue *in_stack_fffffffffffff4f0;
  undefined7 in_stack_fffffffffffff4f8;
  undefined1 in_stack_fffffffffffff4ff;
  UniValue *in_stack_fffffffffffff500;
  undefined7 in_stack_fffffffffffff508;
  undefined1 in_stack_fffffffffffff50f;
  const_string *in_stack_fffffffffffff510;
  undefined7 in_stack_fffffffffffff518;
  undefined1 in_stack_fffffffffffff51f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff520;
  const_string *in_stack_fffffffffffff528;
  undefined8 in_stack_fffffffffffff538;
  undefined7 in_stack_fffffffffffff540;
  undefined1 in_stack_fffffffffffff547;
  const_string *in_stack_fffffffffffff548;
  const_string *pcVar7;
  undefined7 in_stack_fffffffffffff568;
  string *in_stack_fffffffffffff590;
  undefined7 in_stack_fffffffffffff5a8;
  undefined1 in_stack_fffffffffffff5af;
  const_string *in_stack_fffffffffffff5b0;
  uint local_898;
  const_string local_880;
  lazy_ostream local_870 [2];
  assertion_result local_850 [4];
  undefined1 local_7e8 [16];
  undefined1 local_7d8 [64];
  const_string local_798;
  lazy_ostream local_788 [2];
  assertion_result local_768 [2];
  char *local_730;
  char *local_728;
  undefined1 local_700 [16];
  undefined1 local_6f0 [64];
  const_string local_6b0;
  lazy_ostream local_6a0 [2];
  assertion_result local_680 [2];
  const_string local_648;
  lazy_ostream local_638 [2];
  assertion_result local_618 [2];
  const_string local_5e0;
  lazy_ostream local_5d0 [2];
  assertion_result local_5b0 [2];
  const_string local_578;
  lazy_ostream local_568 [2];
  assertion_result local_548 [2];
  const_string local_510;
  lazy_ostream local_500 [2];
  assertion_result local_4e0 [6];
  undefined1 local_448 [24];
  const_string local_430 [3];
  lazy_ostream local_400 [2];
  assertion_result local_3e0 [2];
  undefined1 local_3a8 [16];
  undefined8 local_398;
  undefined1 *puStack_390;
  _Optional_payload_base<ChainType> local_388;
  UniValue local_360 [2];
  UniValue local_290 [5];
  UniValue local_d0 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_398 = 0x42b5;
  puStack_390 = json_tests::detail_key_io_valid_bytes;
  jsondata._M_str._0_7_ = in_stack_fffffffffffff540;
  jsondata._M_len = in_stack_fffffffffffff538;
  jsondata._M_str._7_1_ = in_stack_fffffffffffff547;
  read_json(jsondata);
  CKey::CKey((CKey *)in_stack_fffffffffffff4d8);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
             *)in_stack_fffffffffffff4d8);
  SelectParams((ChainType)((ulong)in_stack_fffffffffffff4e0 >> 0x20));
  for (local_898 = 0; sVar4 = UniValue::size((UniValue *)in_stack_fffffffffffff4d8),
      local_898 < sVar4; local_898 = local_898 + 1) {
    pUVar5 = UniValue::operator[](in_stack_fffffffffffff4f0,(size_t)in_stack_fffffffffffff4e8);
    UniValue::write_abi_cxx11_(local_d0,(int)pUVar5,(void *)0x0,0);
    sVar4 = UniValue::size((UniValue *)in_stack_fffffffffffff4d8);
    if (sVar4 < 3) {
      do {
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff4e8,
                   (pointer)in_stack_fffffffffffff4e0,(unsigned_long)in_stack_fffffffffffff4d8);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff4d8);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff51f,in_stack_fffffffffffff518),
                   in_stack_fffffffffffff510,
                   CONCAT17(in_stack_fffffffffffff50f,in_stack_fffffffffffff508),
                   (const_string *)in_stack_fffffffffffff500);
        boost::test_tools::assertion_result::assertion_result
                  ((assertion_result *)in_stack_fffffffffffff4e8,
                   SUB81((ulong)in_stack_fffffffffffff4e0 >> 0x38,0));
        boost::unit_test::lazy_ostream::instance();
        boost::unit_test::operator<<
                  ((lazy_ostream *)in_stack_fffffffffffff4e0,
                   (char (*) [11])in_stack_fffffffffffff4d8);
        boost::unit_test::operator<<
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[11],_const_char_(&)[11]>
                    *)in_stack_fffffffffffff4e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff4d8);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff4e8,
                   (pointer)in_stack_fffffffffffff4e0,(unsigned_long)in_stack_fffffffffffff4d8);
        in_stack_fffffffffffff4d8 = (char *)0x0;
        boost::test_tools::tt_detail::report_assertion(local_3e0,local_400,local_430,0x23,CHECK);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[11],_const_char_(&)[11]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[11],_const_char_(&)[11]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                    *)in_stack_fffffffffffff4d8);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[11],_const_char_(&)[11]>::
        ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[11],_const_char_(&)[11]>
                            *)in_stack_fffffffffffff4d8);
        boost::test_tools::assertion_result::~assertion_result
                  ((assertion_result *)in_stack_fffffffffffff4d8);
        bVar1 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar1);
    }
    else {
      UniValue::operator[](in_stack_fffffffffffff4f0,(size_t)in_stack_fffffffffffff4e8);
      UniValue::get_str_abi_cxx11_(in_stack_fffffffffffff4e0);
      std::__cxx11::string::string
                (in_stack_fffffffffffff520,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff51f,in_stack_fffffffffffff518));
      UniValue::operator[](in_stack_fffffffffffff4f0,(size_t)in_stack_fffffffffffff4e8);
      UniValue::get_str_abi_cxx11_(in_stack_fffffffffffff4e0);
      std::__cxx11::string::operator_cast_to_basic_string_view
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff4ff,in_stack_fffffffffffff4f8));
      hex_str._M_len._7_1_ = in_stack_fffffffffffff547;
      hex_str._M_len._0_7_ = in_stack_fffffffffffff540;
      hex_str._M_str = (char *)in_stack_fffffffffffff548;
      ParseHex<std::byte>(hex_str);
      UniValue::operator[](in_stack_fffffffffffff4f0,(size_t)in_stack_fffffffffffff4e8);
      UniValue::get_obj(in_stack_fffffffffffff4e0);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT17(in_stack_fffffffffffff4ff,in_stack_fffffffffffff4f8),
                 (char *)in_stack_fffffffffffff4f0);
      key._M_str = (char *)in_stack_fffffffffffff528;
      key._M_len = (size_t)in_stack_fffffffffffff520;
      UniValue::find_value(in_stack_fffffffffffff500,key);
      bVar1 = UniValue::get_bool(in_stack_fffffffffffff4e0);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT17(in_stack_fffffffffffff4ff,in_stack_fffffffffffff4f8),
                 (char *)in_stack_fffffffffffff4f0);
      key_00._M_str = (char *)in_stack_fffffffffffff528;
      key_00._M_len = (size_t)in_stack_fffffffffffff520;
      UniValue::find_value(in_stack_fffffffffffff500,key_00);
      UniValue::get_str_abi_cxx11_(in_stack_fffffffffffff4e0);
      std::__cxx11::string::operator_cast_to_basic_string_view
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff4ff,in_stack_fffffffffffff4f8));
      chain._M_len._7_1_ = in_stack_fffffffffffff5af;
      chain._M_len._0_7_ = in_stack_fffffffffffff5a8;
      chain._M_str = (char *)in_stack_fffffffffffff5b0;
      local_388 = (_Optional_payload_base<ChainType>)ChainTypeFromString(chain);
      std::optional<ChainType>::value((optional<ChainType> *)in_stack_fffffffffffff4e8);
      SelectParams((ChainType)((ulong)in_stack_fffffffffffff4e0 >> 0x20));
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT17(in_stack_fffffffffffff4ff,in_stack_fffffffffffff4f8),
                 (char *)in_stack_fffffffffffff4f0);
      key_01._M_str = (char *)in_stack_fffffffffffff528;
      key_01._M_len = (size_t)in_stack_fffffffffffff520;
      UniValue::find_value(in_stack_fffffffffffff500,key_01);
      bVar2 = UniValue::isNull((UniValue *)in_stack_fffffffffffff4d8);
      if (!bVar2) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   CONCAT17(in_stack_fffffffffffff4ff,in_stack_fffffffffffff4f8),
                   (char *)in_stack_fffffffffffff4f0);
        key_02._M_str = (char *)in_stack_fffffffffffff528;
        key_02._M_len = (size_t)in_stack_fffffffffffff520;
        UniValue::find_value(in_stack_fffffffffffff500,key_02);
        UniValue::get_bool(in_stack_fffffffffffff4e0);
      }
      if (bVar1) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   CONCAT17(in_stack_fffffffffffff4ff,in_stack_fffffffffffff4f8),
                   (char *)in_stack_fffffffffffff4f0);
        key_03._M_str = (char *)in_stack_fffffffffffff528;
        key_03._M_len = (size_t)in_stack_fffffffffffff520;
        UniValue::find_value(in_stack_fffffffffffff500,key_03);
        UniValue::get_bool(in_stack_fffffffffffff4e0);
        DecodeSecret(in_stack_fffffffffffff590);
        CKey::operator=((CKey *)in_stack_fffffffffffff4e8,(CKey *)in_stack_fffffffffffff4e0);
        CKey::~CKey((CKey *)in_stack_fffffffffffff4d8);
        do {
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_fffffffffffff4e8,
                     (pointer)in_stack_fffffffffffff4e0,(unsigned_long)in_stack_fffffffffffff4d8);
          boost::unit_test::basic_cstring<const_char>::basic_cstring
                    ((basic_cstring<const_char> *)in_stack_fffffffffffff4d8);
          boost::unit_test::unit_test_log_t::set_checkpoint
                    ((unit_test_log_t *)
                     CONCAT17(in_stack_fffffffffffff51f,in_stack_fffffffffffff518),
                     in_stack_fffffffffffff510,
                     CONCAT17(in_stack_fffffffffffff50f,in_stack_fffffffffffff508),
                     (const_string *)in_stack_fffffffffffff500);
          CKey::IsValid((CKey *)in_stack_fffffffffffff4d8);
          boost::test_tools::assertion_result::assertion_result
                    ((assertion_result *)in_stack_fffffffffffff4e8,
                     SUB81((ulong)in_stack_fffffffffffff4e0 >> 0x38,0));
          boost::unit_test::lazy_ostream::instance();
          std::operator+((char *)in_stack_fffffffffffff528,in_stack_fffffffffffff520);
          boost::unit_test::operator<<
                    ((lazy_ostream *)in_stack_fffffffffffff4e0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff4d8);
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_fffffffffffff4e8,
                     (pointer)in_stack_fffffffffffff4e0,(unsigned_long)in_stack_fffffffffffff4d8);
          in_stack_fffffffffffff4d8 = (char *)0x0;
          boost::test_tools::tt_detail::report_assertion(local_4e0,local_500,&local_510,0x30,CHECK);
          boost::unit_test::
          lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
          ::~lazy_ostream_impl
                    ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                      *)in_stack_fffffffffffff4d8);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff4d8);
          boost::test_tools::assertion_result::~assertion_result
                    ((assertion_result *)in_stack_fffffffffffff4d8);
          bVar1 = boost::test_tools::tt_detail::dummy_cond();
        } while (bVar1);
        do {
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_fffffffffffff4e8,
                     (pointer)in_stack_fffffffffffff4e0,(unsigned_long)in_stack_fffffffffffff4d8);
          boost::unit_test::basic_cstring<const_char>::basic_cstring
                    ((basic_cstring<const_char> *)in_stack_fffffffffffff4d8);
          boost::unit_test::unit_test_log_t::set_checkpoint
                    ((unit_test_log_t *)
                     CONCAT17(in_stack_fffffffffffff51f,in_stack_fffffffffffff518),
                     in_stack_fffffffffffff510,
                     CONCAT17(in_stack_fffffffffffff50f,in_stack_fffffffffffff508),
                     (const_string *)in_stack_fffffffffffff500);
          CKey::IsCompressed((CKey *)in_stack_fffffffffffff4d8);
          boost::test_tools::assertion_result::assertion_result
                    ((assertion_result *)in_stack_fffffffffffff4e8,
                     SUB81((ulong)in_stack_fffffffffffff4e0 >> 0x38,0));
          boost::unit_test::lazy_ostream::instance();
          std::operator+((char *)in_stack_fffffffffffff528,in_stack_fffffffffffff520);
          boost::unit_test::operator<<
                    ((lazy_ostream *)in_stack_fffffffffffff4e0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff4d8);
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_fffffffffffff4e8,
                     (pointer)in_stack_fffffffffffff4e0,(unsigned_long)in_stack_fffffffffffff4d8);
          in_stack_fffffffffffff4d8 = (char *)0x0;
          boost::test_tools::tt_detail::report_assertion(local_548,local_568,&local_578,0x31,CHECK);
          boost::unit_test::
          lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
          ::~lazy_ostream_impl
                    ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                      *)in_stack_fffffffffffff4d8);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff4d8);
          boost::test_tools::assertion_result::~assertion_result
                    ((assertion_result *)in_stack_fffffffffffff4d8);
          bVar1 = boost::test_tools::tt_detail::dummy_cond();
        } while (bVar1);
        do {
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_fffffffffffff4e8,
                     (pointer)in_stack_fffffffffffff4e0,(unsigned_long)in_stack_fffffffffffff4d8);
          boost::unit_test::basic_cstring<const_char>::basic_cstring
                    ((basic_cstring<const_char> *)in_stack_fffffffffffff4d8);
          boost::unit_test::unit_test_log_t::set_checkpoint
                    ((unit_test_log_t *)
                     CONCAT17(in_stack_fffffffffffff51f,in_stack_fffffffffffff518),
                     in_stack_fffffffffffff510,
                     CONCAT17(in_stack_fffffffffffff50f,in_stack_fffffffffffff508),
                     (const_string *)in_stack_fffffffffffff500);
          std::ranges::__equal_fn::
          operator()<CKey_&,_const_std::vector<std::byte,_std::allocator<std::byte>_>_&,_std::ranges::equal_to,_std::identity,_std::identity>
                    ((__equal_fn *)&std::ranges::equal,local_3a8,local_448);
          boost::test_tools::assertion_result::assertion_result
                    ((assertion_result *)in_stack_fffffffffffff4e8,
                     SUB81((ulong)in_stack_fffffffffffff4e0 >> 0x38,0));
          boost::unit_test::lazy_ostream::instance();
          std::operator+((char *)in_stack_fffffffffffff528,in_stack_fffffffffffff520);
          boost::unit_test::operator<<
                    ((lazy_ostream *)in_stack_fffffffffffff4e0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff4d8);
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_fffffffffffff4e8,
                     (pointer)in_stack_fffffffffffff4e0,(unsigned_long)in_stack_fffffffffffff4d8);
          in_stack_fffffffffffff4d8 = (char *)0x0;
          boost::test_tools::tt_detail::report_assertion(local_5b0,local_5d0,&local_5e0,0x32,CHECK);
          boost::unit_test::
          lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
          ::~lazy_ostream_impl
                    ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                      *)in_stack_fffffffffffff4d8);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff4d8);
          boost::test_tools::assertion_result::~assertion_result
                    ((assertion_result *)in_stack_fffffffffffff4d8);
          bVar1 = boost::test_tools::tt_detail::dummy_cond();
        } while (bVar1);
        DecodeDestination((string *)in_stack_fffffffffffff500);
        std::
        variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        ::operator=((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                     *)in_stack_fffffffffffff4e8,
                    (variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                     *)in_stack_fffffffffffff4e0);
        std::
        variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                    *)in_stack_fffffffffffff4d8);
        do {
          in_stack_fffffffffffff5b0 = boost::unit_test::(anonymous_namespace)::unit_test_log;
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_fffffffffffff4e8,
                     (pointer)in_stack_fffffffffffff4e0,(unsigned_long)in_stack_fffffffffffff4d8);
          boost::unit_test::basic_cstring<const_char>::basic_cstring
                    ((basic_cstring<const_char> *)in_stack_fffffffffffff4d8);
          boost::unit_test::unit_test_log_t::set_checkpoint
                    ((unit_test_log_t *)
                     CONCAT17(in_stack_fffffffffffff51f,in_stack_fffffffffffff518),
                     in_stack_fffffffffffff510,
                     CONCAT17(in_stack_fffffffffffff50f,in_stack_fffffffffffff508),
                     (const_string *)in_stack_fffffffffffff500);
          in_stack_fffffffffffff5af =
               IsValidDestination((CTxDestination *)in_stack_fffffffffffff4e0);
          boost::test_tools::assertion_result::assertion_result
                    ((assertion_result *)in_stack_fffffffffffff4e8,
                     SUB81((ulong)in_stack_fffffffffffff4e0 >> 0x38,0));
          boost::unit_test::lazy_ostream::instance();
          std::operator+((char *)in_stack_fffffffffffff528,in_stack_fffffffffffff520);
          boost::unit_test::operator<<
                    ((lazy_ostream *)in_stack_fffffffffffff4e0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff4d8);
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_fffffffffffff4e8,
                     (pointer)in_stack_fffffffffffff4e0,(unsigned_long)in_stack_fffffffffffff4d8);
          in_stack_fffffffffffff4d8 = (char *)0x0;
          boost::test_tools::tt_detail::report_assertion(local_618,local_638,&local_648,0x36,CHECK);
          boost::unit_test::
          lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
          ::~lazy_ostream_impl
                    ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                      *)in_stack_fffffffffffff4d8);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff4d8);
          boost::test_tools::assertion_result::~assertion_result
                    ((assertion_result *)in_stack_fffffffffffff4d8);
          bVar1 = boost::test_tools::tt_detail::dummy_cond();
        } while (bVar1);
      }
      else {
        DecodeDestination((string *)in_stack_fffffffffffff500);
        in_stack_fffffffffffff590 = (string *)((long)&local_d0[0].val.field_2 + 8);
        std::
        variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        ::operator=((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                     *)in_stack_fffffffffffff4e8,
                    (variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                     *)in_stack_fffffffffffff4e0);
        std::
        variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                    *)in_stack_fffffffffffff4d8);
        GetScriptForDestination((CTxDestination *)in_stack_fffffffffffff4d8);
        do {
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_fffffffffffff4e8,
                     (pointer)in_stack_fffffffffffff4e0,(unsigned_long)in_stack_fffffffffffff4d8);
          boost::unit_test::basic_cstring<const_char>::basic_cstring
                    ((basic_cstring<const_char> *)in_stack_fffffffffffff4d8);
          boost::unit_test::unit_test_log_t::set_checkpoint
                    ((unit_test_log_t *)
                     CONCAT17(in_stack_fffffffffffff51f,in_stack_fffffffffffff518),
                     in_stack_fffffffffffff510,
                     CONCAT17(in_stack_fffffffffffff50f,in_stack_fffffffffffff508),
                     (const_string *)in_stack_fffffffffffff500);
          IsValidDestination((CTxDestination *)in_stack_fffffffffffff4e0);
          boost::test_tools::assertion_result::assertion_result
                    ((assertion_result *)in_stack_fffffffffffff4e8,
                     SUB81((ulong)in_stack_fffffffffffff4e0 >> 0x38,0));
          boost::unit_test::lazy_ostream::instance();
          std::operator+((char *)in_stack_fffffffffffff528,in_stack_fffffffffffff520);
          boost::unit_test::operator<<
                    ((lazy_ostream *)in_stack_fffffffffffff4e0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff4d8);
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_fffffffffffff4e8,
                     (pointer)in_stack_fffffffffffff4e0,(unsigned_long)in_stack_fffffffffffff4d8);
          in_stack_fffffffffffff4d8 = (char *)0x0;
          boost::test_tools::tt_detail::report_assertion(local_680,local_6a0,&local_6b0,0x3b,CHECK);
          boost::unit_test::
          lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
          ::~lazy_ostream_impl
                    ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                      *)in_stack_fffffffffffff4d8);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff4d8);
          boost::test_tools::assertion_result::~assertion_result
                    ((assertion_result *)in_stack_fffffffffffff4d8);
          uVar3 = boost::test_tools::tt_detail::dummy_cond();
        } while ((bool)uVar3);
        do {
          pcVar7 = boost::unit_test::(anonymous_namespace)::unit_test_log;
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_fffffffffffff4e8,
                     (pointer)in_stack_fffffffffffff4e0,(unsigned_long)in_stack_fffffffffffff4d8);
          boost::unit_test::basic_cstring<const_char>::basic_cstring
                    ((basic_cstring<const_char> *)in_stack_fffffffffffff4d8);
          boost::unit_test::unit_test_log_t::set_checkpoint
                    ((unit_test_log_t *)
                     CONCAT17(in_stack_fffffffffffff51f,in_stack_fffffffffffff518),
                     in_stack_fffffffffffff510,
                     CONCAT17(in_stack_fffffffffffff50f,in_stack_fffffffffffff508),
                     (const_string *)in_stack_fffffffffffff500);
          boost::unit_test::lazy_ostream::instance();
          boost::unit_test::operator<<
                    ((lazy_ostream *)in_stack_fffffffffffff4e0,
                     (char (*) [1])in_stack_fffffffffffff4d8);
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_fffffffffffff4e8,
                     (pointer)in_stack_fffffffffffff4e0,(unsigned_long)in_stack_fffffffffffff4d8);
          Span<const_unsigned_char>::Span<CScript>
                    ((Span<const_unsigned_char> *)in_stack_fffffffffffff4e8,
                     (CScript *)in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
          s_01.m_size._0_7_ = in_stack_fffffffffffff568;
          s_01.m_data = (uchar *)pcVar7;
          s_01.m_size._7_1_ = uVar3;
          HexStr_abi_cxx11_(s_01);
          Span<std::byte_const>::Span<std::vector<std::byte,std::allocator<std::byte>>>
                    ((Span<const_std::byte> *)in_stack_fffffffffffff4e8,
                     (vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffff4e0,
                     in_stack_fffffffffffff4d8);
          s.m_size._0_7_ = in_stack_fffffffffffff508;
          s.m_data = (byte *)in_stack_fffffffffffff500;
          s.m_size._7_1_ = in_stack_fffffffffffff50f;
          HexStr_abi_cxx11_(s);
          in_stack_fffffffffffff4e8 = "HexStr(exp_payload)";
          in_stack_fffffffffffff4e0 = local_290;
          in_stack_fffffffffffff4d8 = "HexStr(script)";
          boost::test_tools::tt_detail::
          check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
                    (local_6f0,local_700,0x3c,1,2,
                     (undefined1 *)((long)&local_290[0].val.field_2 + 8));
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff4d8);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff4d8);
          boost::unit_test::
          lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
          ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                              *)in_stack_fffffffffffff4d8);
          bVar1 = boost::test_tools::tt_detail::dummy_cond();
        } while (bVar1);
        local_728 = (char *)std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_fffffffffffff4d8);
        local_730 = (char *)std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_fffffffffffff4e8);
        while (bVar1 = __gnu_cxx::
                       operator==<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)in_stack_fffffffffffff4e8,
                                  (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)in_stack_fffffffffffff4e0), ((bVar1 ^ 0xffU) & 1) != 0) {
          pcVar6 = __gnu_cxx::
                   __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)in_stack_fffffffffffff4d8);
          if ((*pcVar6 < 'a') || ('z' < *pcVar6)) {
            if (('@' < *pcVar6) && (*pcVar6 < '[')) {
              *pcVar6 = *pcVar6 + ' ';
            }
          }
          else {
            *pcVar6 = *pcVar6 + -0x20;
          }
          __gnu_cxx::
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator++((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_fffffffffffff4d8);
        }
        DecodeDestination((string *)in_stack_fffffffffffff500);
        std::
        variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        ::operator=((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                     *)in_stack_fffffffffffff4e8,
                    (variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                     *)in_stack_fffffffffffff4e0);
        std::
        variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                    *)in_stack_fffffffffffff4d8);
        do {
          in_stack_fffffffffffff548 = boost::unit_test::(anonymous_namespace)::unit_test_log;
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_fffffffffffff4e8,
                     (pointer)in_stack_fffffffffffff4e0,(unsigned_long)in_stack_fffffffffffff4d8);
          boost::unit_test::basic_cstring<const_char>::basic_cstring
                    ((basic_cstring<const_char> *)in_stack_fffffffffffff4d8);
          boost::unit_test::unit_test_log_t::set_checkpoint
                    ((unit_test_log_t *)
                     CONCAT17(in_stack_fffffffffffff51f,in_stack_fffffffffffff518),
                     in_stack_fffffffffffff510,
                     CONCAT17(in_stack_fffffffffffff50f,in_stack_fffffffffffff508),
                     (const_string *)in_stack_fffffffffffff500);
          in_stack_fffffffffffff547 =
               IsValidDestination((CTxDestination *)in_stack_fffffffffffff4e0);
          boost::test_tools::assertion_result::assertion_result
                    ((assertion_result *)in_stack_fffffffffffff4e8,
                     SUB81((ulong)in_stack_fffffffffffff4e0 >> 0x38,0));
          boost::unit_test::lazy_ostream::instance();
          std::operator+((char *)in_stack_fffffffffffff528,in_stack_fffffffffffff520);
          boost::unit_test::operator<<
                    ((lazy_ostream *)in_stack_fffffffffffff4e0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff4d8);
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_fffffffffffff4e8,
                     (pointer)in_stack_fffffffffffff4e0,(unsigned_long)in_stack_fffffffffffff4d8);
          in_stack_fffffffffffff4d8 = (char *)0x0;
          boost::test_tools::tt_detail::report_assertion(local_768,local_788,&local_798,0x47,CHECK);
          boost::unit_test::
          lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
          ::~lazy_ostream_impl
                    ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                      *)in_stack_fffffffffffff4d8);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff4d8);
          boost::test_tools::assertion_result::~assertion_result
                    ((assertion_result *)in_stack_fffffffffffff4d8);
          bVar1 = boost::test_tools::tt_detail::dummy_cond();
        } while (bVar1);
        bVar1 = IsValidDestination((CTxDestination *)in_stack_fffffffffffff4e0);
        if (bVar1) {
          GetScriptForDestination((CTxDestination *)in_stack_fffffffffffff4d8);
          CScript::operator=((CScript *)in_stack_fffffffffffff4e8,
                             (CScript *)in_stack_fffffffffffff4e0);
          CScript::~CScript((CScript *)in_stack_fffffffffffff4d8);
          do {
            in_stack_fffffffffffff528 = boost::unit_test::(anonymous_namespace)::unit_test_log;
            boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                      ((basic_cstring<const_char> *)in_stack_fffffffffffff4e8,
                       (pointer)in_stack_fffffffffffff4e0,(unsigned_long)in_stack_fffffffffffff4d8);
            boost::unit_test::basic_cstring<const_char>::basic_cstring
                      ((basic_cstring<const_char> *)in_stack_fffffffffffff4d8);
            boost::unit_test::unit_test_log_t::set_checkpoint
                      ((unit_test_log_t *)
                       CONCAT17(in_stack_fffffffffffff51f,in_stack_fffffffffffff518),
                       in_stack_fffffffffffff510,
                       CONCAT17(in_stack_fffffffffffff50f,in_stack_fffffffffffff508),
                       (const_string *)in_stack_fffffffffffff500);
            in_stack_fffffffffffff520 =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 boost::unit_test::lazy_ostream::instance();
            boost::unit_test::operator<<
                      ((lazy_ostream *)in_stack_fffffffffffff4e0,
                       (char (*) [1])in_stack_fffffffffffff4d8);
            boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                      ((basic_cstring<const_char> *)in_stack_fffffffffffff4e8,
                       (pointer)in_stack_fffffffffffff4e0,(unsigned_long)in_stack_fffffffffffff4d8);
            Span<const_unsigned_char>::Span<CScript>
                      ((Span<const_unsigned_char> *)in_stack_fffffffffffff4e8,
                       (CScript *)in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8);
            s_02.m_size._0_7_ = in_stack_fffffffffffff568;
            s_02.m_data = (uchar *)pcVar7;
            s_02.m_size._7_1_ = uVar3;
            HexStr_abi_cxx11_(s_02);
            Span<std::byte_const>::Span<std::vector<std::byte,std::allocator<std::byte>>>
                      ((Span<const_std::byte> *)in_stack_fffffffffffff4e8,
                       (vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffff4e0,
                       in_stack_fffffffffffff4d8);
            s_00.m_size._0_7_ = in_stack_fffffffffffff508;
            s_00.m_data = (byte *)in_stack_fffffffffffff500;
            s_00.m_size._7_1_ = in_stack_fffffffffffff50f;
            HexStr_abi_cxx11_(s_00);
            in_stack_fffffffffffff4e8 = "HexStr(exp_payload)";
            in_stack_fffffffffffff4e0 = local_360;
            in_stack_fffffffffffff4d8 = "HexStr(script)";
            boost::test_tools::tt_detail::
            check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
                      (local_7d8,local_7e8,0x4a,1,2,
                       (undefined1 *)((long)&local_360[0].val.field_2 + 8));
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff4d8);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff4d8);
            boost::unit_test::
            lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
            ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                                *)in_stack_fffffffffffff4d8);
            in_stack_fffffffffffff51f = boost::test_tools::tt_detail::dummy_cond();
          } while ((bool)in_stack_fffffffffffff51f);
        }
        DecodeSecret(in_stack_fffffffffffff590);
        CKey::operator=((CKey *)in_stack_fffffffffffff4e8,(CKey *)in_stack_fffffffffffff4e0);
        CKey::~CKey((CKey *)in_stack_fffffffffffff4d8);
        do {
          in_stack_fffffffffffff510 = boost::unit_test::(anonymous_namespace)::unit_test_log;
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_fffffffffffff4e8,
                     (pointer)in_stack_fffffffffffff4e0,(unsigned_long)in_stack_fffffffffffff4d8);
          boost::unit_test::basic_cstring<const_char>::basic_cstring
                    ((basic_cstring<const_char> *)in_stack_fffffffffffff4d8);
          boost::unit_test::unit_test_log_t::set_checkpoint
                    ((unit_test_log_t *)
                     CONCAT17(in_stack_fffffffffffff51f,in_stack_fffffffffffff518),
                     in_stack_fffffffffffff510,
                     CONCAT17(in_stack_fffffffffffff50f,in_stack_fffffffffffff508),
                     (const_string *)in_stack_fffffffffffff500);
          in_stack_fffffffffffff50f = CKey::IsValid((CKey *)in_stack_fffffffffffff4d8);
          boost::test_tools::assertion_result::assertion_result
                    ((assertion_result *)in_stack_fffffffffffff4e8,
                     SUB81((ulong)in_stack_fffffffffffff4e0 >> 0x38,0));
          in_stack_fffffffffffff500 = (UniValue *)boost::unit_test::lazy_ostream::instance();
          std::operator+((char *)in_stack_fffffffffffff528,in_stack_fffffffffffff520);
          boost::unit_test::operator<<
                    ((lazy_ostream *)in_stack_fffffffffffff4e0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff4d8);
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)in_stack_fffffffffffff4e8,
                     (pointer)in_stack_fffffffffffff4e0,(unsigned_long)in_stack_fffffffffffff4d8);
          in_stack_fffffffffffff4d8 = (char *)0x0;
          boost::test_tools::tt_detail::report_assertion(local_850,local_870,&local_880,0x4f,CHECK);
          boost::unit_test::
          lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
          ::~lazy_ostream_impl
                    ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                      *)in_stack_fffffffffffff4d8);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff4d8);
          boost::test_tools::assertion_result::~assertion_result
                    ((assertion_result *)in_stack_fffffffffffff4d8);
          in_stack_fffffffffffff4ff = boost::test_tools::tt_detail::dummy_cond();
        } while ((bool)in_stack_fffffffffffff4ff);
        CScript::~CScript((CScript *)in_stack_fffffffffffff4d8);
      }
      std::vector<std::byte,_std::allocator<std::byte>_>::~vector
                ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffff4e8);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff4d8);
    }
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff4d8);
  }
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_fffffffffffff4d8);
  CKey::~CKey((CKey *)in_stack_fffffffffffff4d8);
  UniValue::~UniValue((UniValue *)in_stack_fffffffffffff4d8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(key_io_valid_parse)
{
    UniValue tests = read_json(json_tests::key_io_valid);
    CKey privkey;
    CTxDestination destination;
    SelectParams(ChainType::MAIN);

    for (unsigned int idx = 0; idx < tests.size(); idx++) {
        const UniValue& test = tests[idx];
        std::string strTest = test.write();
        if (test.size() < 3) { // Allow for extra stuff (useful for comments)
            BOOST_ERROR("Bad test: " << strTest);
            continue;
        }
        std::string exp_base58string = test[0].get_str();
        const std::vector<std::byte> exp_payload{ParseHex<std::byte>(test[1].get_str())};
        const UniValue &metadata = test[2].get_obj();
        bool isPrivkey = metadata.find_value("isPrivkey").get_bool();
        SelectParams(ChainTypeFromString(metadata.find_value("chain").get_str()).value());
        bool try_case_flip = metadata.find_value("tryCaseFlip").isNull() ? false : metadata.find_value("tryCaseFlip").get_bool();
        if (isPrivkey) {
            bool isCompressed = metadata.find_value("isCompressed").get_bool();
            // Must be valid private key
            privkey = DecodeSecret(exp_base58string);
            BOOST_CHECK_MESSAGE(privkey.IsValid(), "!IsValid:" + strTest);
            BOOST_CHECK_MESSAGE(privkey.IsCompressed() == isCompressed, "compressed mismatch:" + strTest);
            BOOST_CHECK_MESSAGE(std::ranges::equal(privkey, exp_payload), "key mismatch:" + strTest);

            // Private key must be invalid public key
            destination = DecodeDestination(exp_base58string);
            BOOST_CHECK_MESSAGE(!IsValidDestination(destination), "IsValid privkey as pubkey:" + strTest);
        } else {
            // Must be valid public key
            destination = DecodeDestination(exp_base58string);
            CScript script = GetScriptForDestination(destination);
            BOOST_CHECK_MESSAGE(IsValidDestination(destination), "!IsValid:" + strTest);
            BOOST_CHECK_EQUAL(HexStr(script), HexStr(exp_payload));

            // Try flipped case version
            for (char& c : exp_base58string) {
                if (c >= 'a' && c <= 'z') {
                    c = (c - 'a') + 'A';
                } else if (c >= 'A' && c <= 'Z') {
                    c = (c - 'A') + 'a';
                }
            }
            destination = DecodeDestination(exp_base58string);
            BOOST_CHECK_MESSAGE(IsValidDestination(destination) == try_case_flip, "!IsValid case flipped:" + strTest);
            if (IsValidDestination(destination)) {
                script = GetScriptForDestination(destination);
                BOOST_CHECK_EQUAL(HexStr(script), HexStr(exp_payload));
            }

            // Public key must be invalid private key
            privkey = DecodeSecret(exp_base58string);
            BOOST_CHECK_MESSAGE(!privkey.IsValid(), "IsValid pubkey as privkey:" + strTest);
        }
    }
}